

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateBins
          (BamStandardIndex *this,uint32_t *begin,uint32_t *end,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins)

{
  uint *in_RDX;
  uint *in_RSI;
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> pVar1;
  uint k;
  _Rb_tree_const_iterator<unsigned_short> in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  undefined4 local_3c;
  
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
            ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
             CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
             (value_type_conflict3 *)in_stack_ffffffffffffff68._M_node);
  local_3c = *in_RSI >> 0x1a;
  while (local_3c = local_3c + 1, local_3c <= (*in_RDX >> 0x1a) + 1) {
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
               (value_type_conflict3 *)in_stack_ffffffffffffff68._M_node);
  }
  for (local_3c = (*in_RSI >> 0x17) + 9; local_3c <= (*in_RDX >> 0x17) + 9; local_3c = local_3c + 1)
  {
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
               (value_type_conflict3 *)in_stack_ffffffffffffff68._M_node);
  }
  for (local_3c = (*in_RSI >> 0x14) + 0x49; local_3c <= (*in_RDX >> 0x14) + 0x49;
      local_3c = local_3c + 1) {
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
               (value_type_conflict3 *)in_stack_ffffffffffffff68._M_node);
  }
  for (local_3c = (*in_RSI >> 0x11) + 0x249; local_3c <= (*in_RDX >> 0x11) + 0x249;
      local_3c = local_3c + 1) {
    pVar1 = std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::
            insert((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                   (value_type_conflict3 *)in_stack_ffffffffffffff68._M_node);
    in_stack_ffffffffffffff68 = pVar1.first._M_node;
    in_stack_ffffffffffffff70 = pVar1.second;
  }
  for (local_3c = (*in_RSI >> 0xe) + 0x1249; local_3c <= (*in_RDX >> 0xe) + 0x1249;
      local_3c = local_3c + 1) {
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
               (value_type_conflict3 *)in_stack_ffffffffffffff68._M_node);
  }
  return;
}

Assistant:

void BamStandardIndex::CalculateCandidateBins(const uint32_t& begin, const uint32_t& end,
                                              std::set<uint16_t>& candidateBins)
{
    // initialize list, bin '0' is always a valid bin
    candidateBins.insert(0);

    // get rest of bins that contain this region
    unsigned int k;
    for (k = 1 + (begin >> 26); k <= 1 + (end >> 26); ++k) {
        candidateBins.insert(k);
    }
    for (k = 9 + (begin >> 23); k <= 9 + (end >> 23); ++k) {
        candidateBins.insert(k);
    }
    for (k = 73 + (begin >> 20); k <= 73 + (end >> 20); ++k) {
        candidateBins.insert(k);
    }
    for (k = 585 + (begin >> 17); k <= 585 + (end >> 17); ++k) {
        candidateBins.insert(k);
    }
    for (k = 4681 + (begin >> 14); k <= 4681 + (end >> 14); ++k) {
        candidateBins.insert(k);
    }
}